

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall cmExportFileGenerator::GenerateImportFile(cmExportFileGenerator *this)

{
  auto_ptr<cmGeneratedFileStream> *this_00;
  byte bVar1;
  int iVar2;
  basic_ofstream<char,_std::char_traits<char>_> *pbVar3;
  char *pcVar4;
  cmGeneratedFileStream *pcVar5;
  ostream *poVar6;
  allocator local_229;
  string local_228 [6];
  bool result;
  basic_ofstream<char,_std::char_traits<char>_> *local_208;
  ostream *os;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  ostringstream e;
  string local_60 [8];
  string se;
  auto_ptr<cmGeneratedFileStream> ap_1;
  auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> local_28;
  auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> ap;
  auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> foutPtr;
  cmExportFileGenerator *this_local;
  
  ::cm::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::auto_ptr
            (&ap,(basic_ofstream<char,_std::char_traits<char>_> *)0x0);
  if ((this->AppendMode & 1U) == 0) {
    pcVar5 = (cmGeneratedFileStream *)operator_new(0x248);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream(pcVar5,pcVar4,true,None);
    this_00 = (auto_ptr<cmGeneratedFileStream> *)((long)&se.field_2 + 8);
    ::cm::auto_ptr<cmGeneratedFileStream>::auto_ptr(this_00,pcVar5);
    pcVar5 = ::cm::auto_ptr<cmGeneratedFileStream>::operator->(this_00);
    cmGeneratedFileStream::SetCopyIfDifferent(pcVar5,true);
    ::cm::auto_ptr<std::ofstream>::operator=
              ((auto_ptr<std::ofstream> *)&ap,
               (auto_ptr<cmGeneratedFileStream> *)((long)&se.field_2 + 8));
    ::cm::auto_ptr<cmGeneratedFileStream>::~auto_ptr
              ((auto_ptr<cmGeneratedFileStream> *)((long)&se.field_2 + 8));
  }
  else {
    pbVar3 = (basic_ofstream<char,_std::char_traits<char>_> *)operator_new(0x200);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(pbVar3,pcVar4,_S_app);
    ::cm::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::auto_ptr(&local_28,pbVar3);
    ::cm::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::operator=(&ap,&local_28);
    ::cm::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::~auto_ptr(&local_28);
  }
  pbVar3 = ::cm::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::get(&ap);
  if (pbVar3 != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
    pbVar3 = ::cm::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::operator*(&ap);
    bVar1 = std::ios::operator!((ios *)((long)&(pbVar3->
                                               super_basic_ostream<char,_std::char_traits<char>_>).
                                               _vptr_basic_ostream +
                                       (long)(pbVar3->
                                             super_basic_ostream<char,_std::char_traits<char>_>).
                                             _vptr_basic_ostream[-3]));
    if ((bVar1 & 1) == 0) {
      local_208 = ::cm::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::operator*
                            (&ap);
      (*this->_vptr_cmExportFileGenerator[2])(this,local_208);
      pbVar3 = local_208;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"",&local_229);
      (*this->_vptr_cmExportFileGenerator[4])(this,pbVar3,local_228);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      iVar2 = (*this->_vptr_cmExportFileGenerator[0xc])(this,local_208);
      this_local._7_1_ = (bool)((byte)iVar2 & 1);
      (*this->_vptr_cmExportFileGenerator[5])(this,local_208);
      (*this->_vptr_cmExportFileGenerator[3])(this,local_208);
      os._4_4_ = 1;
      goto LAB_00771726;
    }
  }
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  poVar6 = std::operator<<((ostream *)local_1d8,"cannot write to file \"");
  poVar6 = std::operator<<(poVar6,(string *)&this->MainImportFile);
  poVar6 = std::operator<<(poVar6,"\": ");
  std::operator<<(poVar6,local_60);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::string::~string(local_1f8);
  this_local._7_1_ = false;
  os._4_4_ = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::__cxx11::string::~string(local_60);
LAB_00771726:
  ::cm::auto_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::~auto_ptr(&ap);
  return this_local._7_1_;
}

Assistant:

bool cmExportFileGenerator::GenerateImportFile()
{
  // Open the output file to generate it.
  CM_AUTO_PTR<cmsys::ofstream> foutPtr;
  if (this->AppendMode) {
    // Open for append.
    CM_AUTO_PTR<cmsys::ofstream> ap(
      new cmsys::ofstream(this->MainImportFile.c_str(), std::ios::app));
    foutPtr = ap;
  } else {
    // Generate atomically and with copy-if-different.
    CM_AUTO_PTR<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->MainImportFile.c_str(), true));
    ap->SetCopyIfDifferent(true);
    foutPtr = ap;
  }
  if (!foutPtr.get() || !*foutPtr) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << this->MainImportFile << "\": " << se;
    cmSystemTools::Error(e.str().c_str());
    return false;
  }
  std::ostream& os = *foutPtr;

  // Start with the import file header.
  this->GeneratePolicyHeaderCode(os);
  this->GenerateImportHeaderCode(os);

  // Create all the imported targets.
  bool result = this->GenerateMainFile(os);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);
  this->GeneratePolicyFooterCode(os);

  return result;
}